

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

void protocol_addProperty
               (Protocol *aProtocol,char *name,objc_property_attribute_t *attributes,
               uint attributeCount,BOOL isRequiredProperty,BOOL isInstanceProperty)

{
  undefined8 *puVar1;
  int iVar2;
  objc_property_list *poVar3;
  long lVar4;
  objc_property p;
  
  if (((name != (char *)0x0 && aProtocol != (Protocol *)0x0) && (isInstanceProperty != '\0')) &&
     ((objc_class *)aProtocol->isa == &_OBJC_CLASS___IncompleteProtocol)) {
    poVar3 = (&aProtocol->properties)[isRequiredProperty == '\0'];
    if (poVar3 == (objc_property_list *)0x0) {
      poVar3 = (objc_property_list *)calloc(1,0x38);
      poVar3->count = 1;
      poVar3->size = 0x28;
      lVar4 = 0;
    }
    else {
      iVar2 = poVar3->count;
      poVar3->count = iVar2 + 1;
      poVar3 = (objc_property_list *)realloc(poVar3,(long)iVar2 * 0x28 + 0x38);
      lVar4 = (long)poVar3->count + -1;
    }
    (&aProtocol->properties)[isRequiredProperty == '\0'] = poVar3;
    propertyFromAttrs(&p,attributes,attributeCount,name);
    if (poVar3->size != 0x28) {
      __assert_fail("list->size == sizeof(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/protocol.c"
                    ,0x28d,
                    "void protocol_addProperty(Protocol *, const char *, const objc_property_attribute_t *, unsigned int, BOOL, BOOL)"
                   );
    }
    *(SEL *)((long)poVar3 + (lVar4 * 10 + 0xc) * 4) = p.setter;
    puVar1 = (undefined8 *)((long)poVar3 + (lVar4 * 10 + 8) * 4);
    *puVar1 = p.type;
    puVar1[1] = p.getter;
    puVar1 = (undefined8 *)((long)poVar3 + (lVar4 * 10 + 4) * 4);
    *puVar1 = p.name;
    puVar1[1] = p.attributes;
  }
  return;
}

Assistant:

void protocol_addProperty(Protocol *aProtocol,
                          const char *name,
                          const objc_property_attribute_t *attributes,
                          unsigned int attributeCount,
                          BOOL isRequiredProperty,
                          BOOL isInstanceProperty)
{
	if ((NULL == aProtocol) || (NULL == name)) { return; }
	if (aProtocol->isa != (id)&_OBJC_CLASS___IncompleteProtocol) { return; }
	if (!isInstanceProperty) { return; }
	struct objc_property_list **listPtr = 
	    isInstanceProperty ?
	        (isRequiredProperty ? &aProtocol->properties : &aProtocol->optional_properties) :
	        (isRequiredProperty ? &aProtocol->class_properties : &aProtocol->optional_class_properties);
	if (NULL == *listPtr)
	{
		*listPtr = calloc(1, sizeof(struct objc_property_list) + sizeof(struct objc_property));
		(*listPtr)->size = sizeof(struct objc_property);
		(*listPtr)->count = 1;
	}
	else
	{
		(*listPtr)->count++;
		*listPtr = realloc(*listPtr, sizeof(struct objc_property_list) +
				sizeof(struct objc_property) * (*listPtr)->count);
	}
	struct objc_property_list *list = *listPtr;
	int index = list->count-1;
	struct objc_property p = propertyFromAttrs(attributes, attributeCount, name);
	assert(list->size == sizeof(p));
	memcpy(&(list->properties[index]), &p, sizeof(p));
}